

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O1

string * __thiscall
gimage::(anonymous_namespace)::readPNMToken_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,istream *in)

{
  _anonymous_namespace_ _Var1;
  uint uVar2;
  string *psVar3;
  int iVar4;
  char c;
  ostringstream s;
  char local_1b2;
  char local_1b1;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::istream::get((char *)this);
  _Var1 = this[*(long *)(*(long *)this + -0x18) + 0x20];
  while (((byte)_Var1 & 2) == 0) {
    while ((((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 2) == 0 &&
           (iVar4 = isspace((int)local_1b2), iVar4 != 0))) {
      std::istream::get((char *)this);
    }
    if (local_1b2 != '#') break;
    while (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 2) == 0) {
      std::istream::get((char *)this);
    }
    _Var1 = this[*(long *)(*(long *)this + -0x18) + 0x20];
  }
  local_1b0 = __return_storage_ptr__;
  while (((uVar2 = *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x20), (uVar2 & 2) == 0 &&
          (iVar4 = isspace((int)local_1b2), local_1b2 != 0x23)) && (iVar4 == 0))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b1,1);
    std::istream::get((char *)this);
  }
  psVar3 = local_1b0;
  if (((uVar2 & 2) == 0) && (local_1b2 == '#')) {
    std::istream::unget();
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string readPNMToken(std::istream &in)
{
  char c;
  std::ostringstream s;

  // read the first character of the token (ignoring white spaces and
  // comments in front the token)

  in.get(c);

  while (!in.eof())
  {
    while (!in.eof() && isspace(c))
    {
      in.get(c);
    }

    if (c == '#')
    {
      while (!in.eof() && c != '\n' && c != '\r')
      {
        in.get(c);
      }
    }
    else
    {
      break;
    }
  }

  // reading a token until white space or start of comment

  while (!in.eof() && !isspace(c) && c != '#')
  {
    s << c;
    in.get(c);
  }

  // put last character back if it was the start of a comment

  if (!in.eof() && c == '#')
  {
    in.unget();
  }

  return s.str();
}